

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineInputFile.cpp
# Opt level: O0

void __thiscall
Imf_2_5::DeepScanLineInputFile::readPixels(DeepScanLineInputFile *this,int scanLine1,int scanLine2)

{
  value_type pLVar1;
  size_type sVar2;
  ArgExc *pAVar3;
  int *piVar4;
  bool *pbVar5;
  size_type sVar6;
  reference ppLVar7;
  IoExc *this_00;
  long in_RDI;
  stringstream _iex_replace_s;
  BaseExc *e;
  LineBuffer *lineBuffer;
  size_t i_1;
  string *exception;
  int l;
  TaskGroup taskGroup;
  int dl;
  int stop;
  int start;
  int i;
  int scanLineMax;
  int scanLineMin;
  Lock lock;
  undefined7 in_stack_fffffffffffffd90;
  undefined1 in_stack_fffffffffffffd97;
  Mutex *in_stack_fffffffffffffd98;
  Lock *in_stack_fffffffffffffda0;
  int in_stack_fffffffffffffdac;
  undefined8 in_stack_fffffffffffffdb0;
  Data *in_stack_fffffffffffffdb8;
  LineBufferTask_conflict1 *in_stack_fffffffffffffdc0;
  size_type local_68;
  string *local_60;
  int local_54;
  TaskGroup local_50 [12];
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  int local_30;
  int local_10;
  int local_c [3];
  
  IlmThread_2_5::Lock::Lock
            (in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,(bool)in_stack_fffffffffffffd97);
  sVar2 = std::
          vector<Imf_2_5::(anonymous_namespace)::InSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::InSliceInfo_*>_>
          ::size((vector<Imf_2_5::(anonymous_namespace)::InSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::InSliceInfo_*>_>
                  *)(*(long *)(in_RDI + 8) + 0x138));
  if (sVar2 == 0) {
    pAVar3 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::ArgExc::ArgExc(pAVar3,"No frame buffer specified as pixel data destination.");
    __cxa_throw(pAVar3,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
  }
  piVar4 = std::min<int>(local_c,&local_10);
  local_30 = *piVar4;
  piVar4 = std::max<int>(local_c,&local_10);
  local_34 = *piVar4;
  if ((local_30 < *(int *)(*(long *)(in_RDI + 8) + 0xdc)) ||
     (*(int *)(*(long *)(in_RDI + 8) + 0xe0) < local_34)) {
    pAVar3 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::ArgExc::ArgExc(pAVar3,"Tried to read scan line outside the image file\'s data window.")
    ;
    __cxa_throw(pAVar3,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
  }
  for (local_38 = local_30; local_38 <= local_34; local_38 = local_38 + 1) {
    pbVar5 = Array::operator_cast_to_bool_((Array *)(*(long *)(in_RDI + 8) + 0x1b0));
    if ((pbVar5[local_38 - *(int *)(*(long *)(in_RDI + 8) + 0xdc)] & 1U) == 0) {
      pAVar3 = (ArgExc *)__cxa_allocate_exception(0x48);
      Iex_2_5::ArgExc::ArgExc
                (pAVar3,
                 "Tried to read scan line without knowing the sample counts, pleaseread the sample counts first."
                );
      __cxa_throw(pAVar3,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
    }
  }
  if (*(int *)(*(long *)(in_RDI + 8) + 0xd0) == 0) {
    local_3c = (local_30 - *(int *)(*(long *)(in_RDI + 8) + 0xdc)) /
               *(int *)(*(long *)(in_RDI + 8) + 0x168);
    local_40 = (local_34 - *(int *)(*(long *)(in_RDI + 8) + 0xdc)) /
               *(int *)(*(long *)(in_RDI + 8) + 0x168) + 1;
    local_44 = 1;
  }
  else {
    local_3c = (local_34 - *(int *)(*(long *)(in_RDI + 8) + 0xdc)) /
               *(int *)(*(long *)(in_RDI + 8) + 0x168);
    local_40 = (local_30 - *(int *)(*(long *)(in_RDI + 8) + 0xdc)) /
               *(int *)(*(long *)(in_RDI + 8) + 0x168) + -1;
    local_44 = -1;
  }
  IlmThread_2_5::TaskGroup::TaskGroup(local_50);
  for (local_54 = local_3c; local_54 != local_40; local_54 = local_44 + local_54) {
    in_stack_fffffffffffffdc0 =
         anon_unknown_6::newLineBufferTask
                   ((TaskGroup *)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
                    (int)((ulong)in_stack_fffffffffffffdb0 >> 0x20),(int)in_stack_fffffffffffffdb0,
                    in_stack_fffffffffffffdac);
    IlmThread_2_5::ThreadPool::addGlobalTask(&in_stack_fffffffffffffdc0->super_Task);
  }
  IlmThread_2_5::TaskGroup::~TaskGroup(local_50);
  local_60 = (string *)0x0;
  local_68 = 0;
  while( true ) {
    sVar2 = local_68;
    sVar6 = std::
            vector<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
            ::size((vector<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
                    *)(*(long *)(in_RDI + 8) + 0x150));
    if (sVar6 <= sVar2) break;
    ppLVar7 = std::
              vector<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
              ::operator[]((vector<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
                            *)(*(long *)(in_RDI + 8) + 0x150),local_68);
    pLVar1 = *ppLVar7;
    if ((((ulong)pLVar1->compressor & 1) != 0) && (local_60 == (string *)0x0)) {
      local_60 = (string *)&pLVar1->partiallyFull;
    }
    *(undefined1 *)&pLVar1->compressor = 0;
    local_68 = local_68 + 1;
  }
  if (local_60 != (string *)0x0) {
    this_00 = (IoExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::IoExc::IoExc(this_00,local_60);
    __cxa_throw(this_00,&Iex_2_5::IoExc::typeinfo,Iex_2_5::IoExc::~IoExc);
  }
  IlmThread_2_5::Lock::~Lock((Lock *)CONCAT17(in_stack_fffffffffffffd97,in_stack_fffffffffffffd90));
  return;
}

Assistant:

void
DeepScanLineInputFile::readPixels (int scanLine1, int scanLine2)
{
    try
    {
        Lock lock (*_data->_streamData);

        if (_data->slices.size() == 0)
            throw IEX_NAMESPACE::ArgExc ("No frame buffer specified "
                               "as pixel data destination.");

        int scanLineMin = min (scanLine1, scanLine2);
        int scanLineMax = max (scanLine1, scanLine2);

        if (scanLineMin < _data->minY || scanLineMax > _data->maxY)
            throw IEX_NAMESPACE::ArgExc ("Tried to read scan line outside "
                               "the image file's data window.");

        for (int i = scanLineMin; i <= scanLineMax; i++)
        {
            if (_data->gotSampleCount[i - _data->minY] == false)
                throw IEX_NAMESPACE::ArgExc ("Tried to read scan line without "
                                   "knowing the sample counts, please"
                                   "read the sample counts first.");
        }

 
        //
        // We impose a numbering scheme on the lineBuffers where the first
        // scanline is contained in lineBuffer 1.
        //
        // Determine the first and last lineBuffer numbers in this scanline
        // range. We always attempt to read the scanlines in the order that
        // they are stored in the file.
        //

        int start, stop, dl;

        if (_data->lineOrder == INCREASING_Y)
        {
            start = (scanLineMin - _data->minY) / _data->linesInBuffer;
            stop  = (scanLineMax - _data->minY) / _data->linesInBuffer + 1;
            dl = 1;
        }
        else
        {
            start = (scanLineMax - _data->minY) / _data->linesInBuffer;
            stop  = (scanLineMin - _data->minY) / _data->linesInBuffer - 1;
            dl = -1;
        }

        //
        // Create a task group for all line buffer tasks.  When the
        // task group goes out of scope, the destructor waits until
        // all tasks are complete.
        //

        {
            TaskGroup taskGroup;

            //
            // Add the line buffer tasks.
            //
            // The tasks will execute in the order that they are created
            // because we lock the line buffers during construction and the
            // constructors are called by the main thread.  Hence, in order
            // for a successive task to execute the previous task which
            // used that line buffer must have completed already.
            //

            for (int l = start; l != stop; l += dl)
            {
                ThreadPool::addGlobalTask (newLineBufferTask (&taskGroup,
                                                              _data, l,
                                                              scanLineMin,
                                                              scanLineMax));
            }

            //
            // finish all tasks
            //
        }

        //
        // Exeption handling:
        //
        // LineBufferTask::execute() may have encountered exceptions, but
        // those exceptions occurred in another thread, not in the thread
        // that is executing this call to ScanLineInputFile::readPixels().
        // LineBufferTask::execute() has caught all exceptions and stored
        // the exceptions' what() strings in the line buffers.
        // Now we check if any line buffer contains a stored exception; if
        // this is the case then we re-throw the exception in this thread.
        // (It is possible that multiple line buffers contain stored
        // exceptions.  We re-throw the first exception we find and
        // ignore all others.)
        //

        const string *exception = 0;

        for (size_t i = 0; i < _data->lineBuffers.size(); ++i)
        {
            LineBuffer *lineBuffer = _data->lineBuffers[i];

            if (lineBuffer->hasException && !exception)
                exception = &lineBuffer->exception;

            lineBuffer->hasException = false;
        }

        if (exception)
            throw IEX_NAMESPACE::IoExc (*exception);
    }
    catch (IEX_NAMESPACE::BaseExc &e)
    {
        REPLACE_EXC (e, "Error reading pixel data from image "
                     "file \"" << fileName() << "\". " << e.what());
        throw;
    }
}